

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

AggregateFunction * __thiscall
duckdb::ListContinuousQuantile::GetFunction<long,double>
          (AggregateFunction *__return_storage_ptr__,ListContinuousQuantile *this,
          LogicalType *input_type,LogicalType *target_type)

{
  initializer_list<duckdb::LogicalType> __l;
  LogicalType result_type;
  allocator_type local_59;
  LogicalType local_58 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  LogicalType local_28 [24];
  
  duckdb::LogicalType::LIST(local_28);
  duckdb::LogicalType::LogicalType(local_58,(LogicalType *)this);
  __l._M_len = 1;
  __l._M_array = local_58;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_59);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_40,local_28,
             AggregateFunction::StateSize<duckdb::QuantileState<long,duckdb::QuantileStandardType>>,
             AggregateFunction::
             StateInitialize<duckdb::QuantileState<long,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<double,false>,(duckdb::AggregateDestructorType)1>
             ,AggregateFunction::
              UnaryScatterUpdate<duckdb::QuantileState<long,duckdb::QuantileStandardType>,long,duckdb::QuantileListOperation<double,false>>
             ,AggregateFunction::
              StateCombine<duckdb::QuantileState<long,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<double,false>>
             ,AggregateFunction::
              StateFinalize<duckdb::QuantileState<long,duckdb::QuantileStandardType>,duckdb::list_entry_t,duckdb::QuantileListOperation<double,false>>
             ,AggregateFunction::
              UnaryUpdate<duckdb::QuantileState<long,duckdb::QuantileStandardType>,long,duckdb::QuantileListOperation<double,false>>
             ,(bind_aggregate_function_t)0x0,
             AggregateFunction::
             StateDestroy<duckdb::QuantileState<long,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<double,false>>
             ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  duckdb::LogicalType::~LogicalType(local_58);
  duckdb::LogicalType::~LogicalType(local_28);
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  __return_storage_ptr__->window =
       QuantileListOperation<double,false>::
       Window<duckdb::QuantileState<long,duckdb::QuantileStandardType>,long,duckdb::list_entry_t>;
  __return_storage_ptr__->window_init =
       QuantileOperation::WindowInit<duckdb::QuantileState<long,duckdb::QuantileStandardType>,long>;
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetFunction(const LogicalType &input_type, const LogicalType &target_type) {
		using STATE = QuantileState<INPUT_TYPE, QuantileStandardType>;
		using OP = QuantileListOperation<TARGET_TYPE, false>;
		auto fun = QuantileListAggregate<STATE, INPUT_TYPE, list_entry_t, OP>(input_type, target_type);
		fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
#ifndef DUCKDB_SMALLER_BINARY
		fun.window = OP::template Window<STATE, INPUT_TYPE, list_entry_t>;
		fun.window_init = OP::template WindowInit<STATE, INPUT_TYPE>;
#endif
		return fun;
	}